

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O3

int Fxu_UpdatePairCompare(Fxu_Pair **ppP1,Fxu_Pair **ppP2)

{
  int iVar1;
  Fxu_Pair *pFVar2;
  Fxu_Pair *pFVar3;
  int iVar4;
  int iVar5;
  
  pFVar2 = *ppP1;
  pFVar3 = *ppP2;
  iVar1 = pFVar3->pCube1->pVar->iVar;
  iVar4 = -1;
  iVar5 = pFVar2->pCube1->pVar->iVar;
  if (iVar1 <= iVar5) {
    if (iVar1 < iVar5) {
      return 1;
    }
    iVar1 = pFVar2->iCube2;
    if (pFVar2->iCube1 < pFVar2->iCube2) {
      iVar1 = pFVar2->iCube1;
    }
    iVar5 = pFVar3->iCube2;
    if (pFVar3->iCube1 < pFVar3->iCube2) {
      iVar5 = pFVar3->iCube1;
    }
    if ((iVar5 <= iVar1) && (iVar4 = 1, iVar1 <= iVar5)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                    ,0x26e,"int Fxu_UpdatePairCompare(Fxu_Pair **, Fxu_Pair **)");
    }
  }
  return iVar4;
}

Assistant:

int Fxu_UpdatePairCompare( Fxu_Pair ** ppP1, Fxu_Pair ** ppP2 )
{
    Fxu_Cube * pC1 = (*ppP1)->pCube1;
    Fxu_Cube * pC2 = (*ppP2)->pCube1;
    int iP1CubeMin, iP2CubeMin;
    if ( pC1->pVar->iVar < pC2->pVar->iVar )
        return -1;
    if ( pC1->pVar->iVar > pC2->pVar->iVar )
        return 1;
    iP1CubeMin = Fxu_PairMinCubeInt( *ppP1 );
    iP2CubeMin = Fxu_PairMinCubeInt( *ppP2 );
    if ( iP1CubeMin < iP2CubeMin )
        return -1;
    if ( iP1CubeMin > iP2CubeMin )
        return 1;
    assert( 0 );
    return 0;
}